

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::SSLClient::SSLClient
          (SSLClient *this,string *host,int port,string *client_cert_path,string *client_key_path)

{
  int iVar1;
  SSL_METHOD *meth;
  SSL_CTX *pSVar2;
  char *pcVar3;
  char *e;
  ulong uVar4;
  string *psVar5;
  anon_class_8_1_8991fb9c local_68;
  function<void_(const_char_*,_const_char_*)> local_60;
  string *local_30;
  string *client_key_path_local;
  string *client_cert_path_local;
  string *psStack_18;
  int port_local;
  string *host_local;
  SSLClient *this_local;
  
  local_30 = client_key_path;
  client_key_path_local = client_cert_path;
  client_cert_path_local._4_4_ = port;
  psStack_18 = host;
  host_local = (string *)this;
  ClientImpl::ClientImpl(&this->super_ClientImpl,host,port,client_cert_path,client_key_path);
  (this->super_ClientImpl)._vptr_ClientImpl = (_func_int **)&PTR__SSLClient_003ea570;
  std::mutex::mutex(&this->ctx_mutex_);
  std::once_flag::once_flag(&this->initialize_cert_);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->host_components_);
  this->verify_result_ = 0;
  meth = (SSL_METHOD *)TLS_client_method();
  pSVar2 = SSL_CTX_new(meth);
  this->ctx_ = (SSL_CTX *)pSVar2;
  psVar5 = &(this->super_ClientImpl).host_;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psVar5);
  std::__cxx11::string::size();
  e = (char *)std::__cxx11::string::operator[]((ulong)psVar5);
  local_68.this = this;
  std::function<void(char_const*,char_const*)>::
  function<httplib::SSLClient::SSLClient(std::__cxx11::string_const&,int,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*,char_const*)_1_,void>
            ((function<void(char_const*,char_const*)> *)&local_60,&local_68);
  detail::split(pcVar3,e,'.',&local_60);
  std::function<void_(const_char_*,_const_char_*)>::~function(&local_60);
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    pSVar2 = (SSL_CTX *)this->ctx_;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = SSL_CTX_use_certificate_file(pSVar2,pcVar3,1);
    if (iVar1 == 1) {
      pSVar2 = (SSL_CTX *)this->ctx_;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = SSL_CTX_use_PrivateKey_file(pSVar2,pcVar3,1);
      if (iVar1 == 1) {
        return;
      }
    }
    SSL_CTX_free((SSL_CTX *)this->ctx_);
    this->ctx_ = (SSL_CTX *)0x0;
  }
  return;
}

Assistant:

inline SSLClient::SSLClient(const std::string & host, int port,
        const std::string & client_cert_path,
        const std::string & client_key_path)
        : ClientImpl(host, port, client_cert_path, client_key_path) {
        ctx_ = SSL_CTX_new(TLS_client_method());

        detail::split(&host_[0], &host_[host_.size()], '.',
            [&](const char* b, const char* e) {
            host_components_.emplace_back(std::string(b, e));
        });

        if (!client_cert_path.empty() && !client_key_path.empty()) {
            if (SSL_CTX_use_certificate_file(ctx_, client_cert_path.c_str(),
                SSL_FILETYPE_PEM) != 1 ||
                SSL_CTX_use_PrivateKey_file(ctx_, client_key_path.c_str(),
                    SSL_FILETYPE_PEM) != 1) {
                SSL_CTX_free(ctx_);
                ctx_ = nullptr;
            }
        }
    }